

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatasetBuilder.cpp
# Opt level: O2

void __thiscall
DatasetBuilder::DatasetBuilder
          (DatasetBuilder *this,BuilderType builder_type,
          vector<IndexType,_std::allocator<IndexType>_> *index_types)

{
  pointer pIVar1;
  
  this->builder_type = builder_type;
  pIVar1 = (index_types->super__Vector_base<IndexType,_std::allocator<IndexType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->index_types).super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (index_types->super__Vector_base<IndexType,_std::allocator<IndexType>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->index_types).super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl.
  super__Vector_impl_data._M_finish = pIVar1;
  (this->index_types).super__Vector_base<IndexType,_std::allocator<IndexType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (index_types->super__Vector_base<IndexType,_std::allocator<IndexType>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (index_types->super__Vector_base<IndexType,_std::allocator<IndexType>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (index_types->super__Vector_base<IndexType,_std::allocator<IndexType>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (index_types->super__Vector_base<IndexType,_std::allocator<IndexType>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->indices).
  super__Vector_base<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->indices).
  super__Vector_base<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fids).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->indices).
  super__Vector_base<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>,_std::allocator<std::unique_ptr<IndexBuilder,_std::default_delete<IndexBuilder>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fids).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fids).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  clear(this);
  return;
}

Assistant:

DatasetBuilder::DatasetBuilder(BuilderType builder_type,
                               std::vector<IndexType> index_types)
    : builder_type(builder_type), index_types(std::move(index_types)) {
    clear();
}